

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O2

bool __thiscall xmrig::OclBackend::isEnabled(OclBackend *this)

{
  OclBackendPrivate *pOVar1;
  Config *this_00;
  OclConfig *pOVar2;
  bool bVar3;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pOVar2 = Config::cl(this_00);
  if (((pOVar2->m_enabled == true) && (OclLib::m_initialized == '\x01')) &&
     (pOVar1 = this->d_ptr, (pOVar1->platform).m_id != (cl_platform_id)0x0)) {
    bVar3 = (pOVar1->devices).
            super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pOVar1->devices).
            super__Vector_base<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>._M_impl.
            super__Vector_impl_data._M_finish;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool xmrig::OclBackend::isEnabled() const
{
    return d_ptr->controller->config()->cl().isEnabled() && OclLib::isInitialized() && d_ptr->platform.isValid() && !d_ptr->devices.empty();
}